

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

lua_Integer lua_tointegerx(lua_State *L,int idx,int *pisnum)

{
  int iVar1;
  TValue *obj;
  lua_Integer res;
  GCObject *local_10;
  
  obj = index2addr(L,idx);
  if (obj->tt_ == 0x13) {
    local_10 = (obj->value_).gc;
    iVar1 = 1;
  }
  else {
    iVar1 = luaV_tointeger(obj,(lua_Integer *)&local_10,0);
  }
  if (iVar1 == 0) {
    local_10 = (GCObject *)0x0;
  }
  if (pisnum != (int *)0x0) {
    *pisnum = iVar1;
  }
  return (lua_Integer)local_10;
}

Assistant:

LUA_API lua_Integer lua_tointegerx(lua_State *L, int idx, int *pisnum) {
    lua_Integer res;
    const TValue *o = index2addr(L, idx);
    int isnum = tointeger(o, &res);
    if (!isnum)
        res = 0;  /* call to 'tointeger' may change 'n' even if it fails */
    if (pisnum) *pisnum = isnum;
    return res;
}